

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

ODITHER_MATRIX_PTR make_odither_array(j_decompress_ptr cinfo,int ncolors)

{
  ODITHER_MATRIX_PTR paiVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int local_40;
  INT32 den;
  INT32 num;
  int k;
  int j;
  ODITHER_MATRIX_PTR odither;
  int ncolors_local;
  j_decompress_ptr cinfo_local;
  
  paiVar1 = (ODITHER_MATRIX_PTR)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  lVar2 = (long)(ncolors + -1) << 9;
  for (num._4_4_ = 0; num._4_4_ < 0x10; num._4_4_ = num._4_4_ + 1) {
    for (num._0_4_ = 0; (int)num < 0x10; num._0_4_ = (int)num + 1) {
      lVar3 = (long)(int)((uint)base_dither_matrix[num._4_4_][(int)num] * -2 + 0xff);
      lVar4 = lVar3 * 0xff;
      if (lVar4 < 0) {
        local_40 = -(int)((lVar3 * -0xff) / lVar2);
      }
      else {
        local_40 = (int)(lVar4 / lVar2);
      }
      paiVar1[num._4_4_][(int)num] = local_40;
    }
  }
  return paiVar1;
}

Assistant:

LOCAL(ODITHER_MATRIX_PTR)
make_odither_array (j_decompress_ptr cinfo, int ncolors)
{
  ODITHER_MATRIX_PTR odither;
  int j,k;
  INT32 num,den;

  odither = (ODITHER_MATRIX_PTR)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(ODITHER_MATRIX));
  /* The inter-value distance for this color is MAXJSAMPLE/(ncolors-1).
   * Hence the dither value for the matrix cell with fill order f
   * (f=0..N-1) should be (N-1-2*f)/(2*N) * MAXJSAMPLE/(ncolors-1).
   * On 16-bit-int machine, be careful to avoid overflow.
   */
  den = 2 * ODITHER_CELLS * ((INT32) (ncolors - 1));
  for (j = 0; j < ODITHER_SIZE; j++) {
    for (k = 0; k < ODITHER_SIZE; k++) {
      num = ((INT32) (ODITHER_CELLS-1 - 2*((int)base_dither_matrix[j][k])))
	    * MAXJSAMPLE;
      /* Ensure round towards zero despite C's lack of consistency
       * about rounding negative values in integer division...
       */
      odither[j][k] = (int) (num<0 ? -((-num)/den) : num/den);
    }
  }
  return odither;
}